

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O0

Matrix33 * __thiscall AML::Matrix33::operator/=(Matrix33 *this,double rhs)

{
  double rhs_local;
  Matrix33 *this_local;
  
  (this->field_0).data[0][0] = (this->field_0).data[0][0] / rhs;
  (this->field_0).data[0][1] = (this->field_0).data[0][1] / rhs;
  (this->field_0).data[0][2] = (this->field_0).data[0][2] / rhs;
  (this->field_0).data[1][0] = (this->field_0).data[1][0] / rhs;
  (this->field_0).data[1][1] = (this->field_0).data[1][1] / rhs;
  (this->field_0).data[1][2] = (this->field_0).data[1][2] / rhs;
  (this->field_0).data[2][0] = (this->field_0).data[2][0] / rhs;
  (this->field_0).data[2][1] = (this->field_0).data[2][1] / rhs;
  (this->field_0).data[2][2] = (this->field_0).data[2][2] / rhs;
  return this;
}

Assistant:

Matrix33& Matrix33::operator/=(double rhs)
    {
        m11 /= rhs;
        m12 /= rhs;
        m13 /= rhs;
        m21 /= rhs;
        m22 /= rhs;
        m23 /= rhs;
        m31 /= rhs;
        m32 /= rhs;
        m33 /= rhs;
        return *this;
    }